

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O0

String * __thiscall asl::String::trimmed(String *__return_storage_ptr__,String *this)

{
  int j_00;
  bool bVar1;
  char *pcVar2;
  char *s;
  int local_20;
  int n;
  int j;
  int i;
  String *this_local;
  
  local_20 = this->_len;
  pcVar2 = str(this);
  n = 0;
  while ((n < local_20 && (bVar1 = myisspace(pcVar2[n]), bVar1))) {
    n = n + 1;
  }
  do {
    j_00 = local_20;
    local_20 = j_00 + -1;
    if (local_20 < n) break;
    bVar1 = myisspace(pcVar2[local_20]);
  } while (bVar1);
  substring(__return_storage_ptr__,this,n,j_00);
  return __return_storage_ptr__;
}

Assistant:

String String::trimmed() const
{
	int i,j, n=_len;
	const char* s = str();
	for(i=0; i<n; i++)
		if(!myisspace(s[i])) break;
	for(j=n-1; j>=i; j--)
		if(!myisspace(s[j])) break;
	return substring(i, j+1);
}